

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GoogleNamerTest.cpp
# Opt level: O2

void __thiscall
GoogleNamerTest_TestSuffixMatcher_Test::~GoogleNamerTest_TestSuffixMatcher_Test
          (GoogleNamerTest_TestSuffixMatcher_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(GoogleNamerTest, TestSuffixMatcher)
{
    std::string suffix = "Test";
    std::string fileName = "/a/b/c/testGoogleNamer.cpp";
    std::vector<std::string> testCaseNames = {"GoogleNamerTest",
                                              "GoogleNamer",
                                              "GoogleTest",
                                              "NamerTest",
                                              "NamerTestTest",
                                              "NamerTestTests",
                                              "TestTest",
                                              "Test"};
    Approvals::verifyAll<std::vector<std::string>>(
        "suffix: " + suffix + "\nfilename: " + fileName + "\ntest case names:",
        testCaseNames,
        [&](const std::string& test, std::ostream& os) {
            os << test << ": " << createSuffix(suffix, fileName, test);
        });
}